

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImDrawCornerFlags rounding_corners;
  ImVec2 pos_00;
  ImVec2 IVar1;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiID id;
  ImU32 IVar5;
  ImU32 col;
  ImGuiWindow *pIVar6;
  ImGuiContext *g;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool hovered;
  float local_110;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  float local_88;
  float fStack_84;
  ImVec2 local_60;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  
  pIVar2 = GImGui;
  uVar8 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar8 & 0xffffffef;
  pIVar6 = pIVar2->CurrentWindow;
  pIVar6->WriteAccessed = true;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui_widgets.cpp"
                  ,0x5ab,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  id = ImGuiWindow::GetID(pIVar6,label,(char *)0x0);
  local_110 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_110 = GetFrameHeight();
  }
  IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar9 = CalcItemWidth();
  fVar10 = local_110;
  if ((flags & 0x40U) == 0) {
    fVar10 = fVar9;
  }
  local_88 = IVar1.x;
  fStack_84 = IVar1.y;
  fVar9 = (pIVar2->Style).FramePadding.y;
  frame_bb.Min.x = (pIVar6->DC).CursorPos.x;
  frame_bb.Min.y = (pIVar6->DC).CursorPos.y;
  frame_bb.Max.x = fVar10 + frame_bb.Min.x;
  frame_bb.Max.y = fVar9 + fVar9 + fStack_84 + frame_bb.Min.y;
  fVar11 = 0.0;
  if (0.0 < local_88) {
    fVar11 = (pIVar2->Style).ItemInnerSpacing.x + local_88;
  }
  total_bb.Max.x = fVar11 + frame_bb.Max.x;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,fVar9);
  bVar3 = ItemAdd(&total_bb,id,&frame_bb);
  if (!bVar3) {
    return false;
  }
  bVar3 = ButtonBehavior(&frame_bb,id,&hovered,&held,0);
  bVar4 = IsPopupOpen(id);
  IVar5 = GetColorU32(hovered + 7,1.0);
  fVar11 = frame_bb.Max.x;
  fVar9 = frame_bb.Min.x;
  RenderNavHighlight(&frame_bb,id,1);
  uVar7 = -(uint)(fVar11 - local_110 <= fVar9);
  fVar9 = (float)(uVar7 & (uint)fVar9 | ~uVar7 & (uint)(fVar11 - local_110));
  if ((flags & 0x40U) == 0) {
    name._4_4_ = frame_bb.Max.y;
    name._0_4_ = fVar9;
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar6->DrawList,&frame_bb.Min,(ImVec2 *)name,IVar5,(pIVar2->Style).FrameRounding,
               rounding_corners);
  }
  if ((flags & 0x20U) == 0) {
    IVar5 = GetColorU32(((byte)(hovered | bVar4) & 1) + 0x15,1.0);
    col = GetColorU32(0,1.0);
    name._4_4_ = frame_bb.Min.y;
    name._0_4_ = fVar9;
    ImDrawList::AddRectFilled
              (pIVar6->DrawList,(ImVec2 *)name,&frame_bb.Max,IVar5,(pIVar2->Style).FrameRounding,
               (uint)(fVar10 <= local_110) * 5 + 10);
    if ((fVar9 + local_110) - (pIVar2->Style).FramePadding.x <= frame_bb.Max.x) {
      fVar11 = (pIVar2->Style).FramePadding.y;
      IVar1.y = fVar11 + frame_bb.Min.y;
      IVar1.x = fVar11 + fVar9;
      RenderArrow(pIVar6->DrawList,IVar1,col,3,1.0);
    }
  }
  p_min.y = frame_bb.Min.y;
  p_min.x = frame_bb.Min.x;
  p_max.y = frame_bb.Max.y;
  p_max.x = frame_bb.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar2->Style).FrameRounding);
  if (preview_value != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar1 = (pIVar2->Style).FramePadding;
    name._0_4_ = IVar1.x + frame_bb.Min.x;
    name._4_4_ = IVar1.y + frame_bb.Min.y;
    r_outer.Min.y = frame_bb.Max.y;
    r_outer.Min.x = fVar9;
    size_expected.x = 0.0;
    size_expected.y = 0.0;
    RenderTextClipped((ImVec2 *)name,&r_outer.Min,preview_value,(char *)0x0,(ImVec2 *)0x0,
                      &size_expected,(ImRect *)0x0);
  }
  if (0.0 < local_88) {
    pos_00.y = (pIVar2->Style).FramePadding.y + frame_bb.Min.y;
    pos_00.x = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    RenderText(pos_00,label,(char *)0x0,true);
  }
  if (bVar3) {
    if (bVar4) goto LAB_00161a4d;
  }
  else if (pIVar2->NavActivateId != id || bVar4) {
    if (!bVar4) {
      return false;
    }
    goto LAB_00161a4d;
  }
  if ((pIVar6->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar6->NavLastIds[0] = id;
  }
  OpenPopupEx(id);
LAB_00161a4d:
  if ((uVar8 & 0x10) == 0) {
    uVar8 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar8 = flags;
    }
    uVar7 = (uVar8 & 0x1e) - 1;
    if ((uVar8 & 0x1e ^ uVar7) <= uVar7) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui_widgets.cpp"
                    ,0x5e5,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    if ((uVar8 & 4) == 0) {
      if ((uVar8 & 2) == 0) {
        uVar7 = -(uint)((uVar8 & 8) == 0) | 0x14;
      }
      else {
        uVar7 = 4;
      }
    }
    else {
      uVar7 = 8;
    }
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name._0_4_ = fVar10;
    fVar10 = CalcMaxPopupHeightFromItemCount(uVar7);
    r_outer.Min.y = fVar10;
    r_outer.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints((ImVec2 *)name,&r_outer.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
    flags = uVar8;
  }
  else {
    *(byte *)&(pIVar2->NextWindowData).Flags = (byte)(pIVar2->NextWindowData).Flags | 0x10;
    fVar9 = (pIVar2->NextWindowData).SizeConstraintRect.Min.x;
    uVar8 = -(uint)(fVar10 <= fVar9);
    (pIVar2->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar8 & (uint)fVar10 | (uint)fVar9 & uVar8);
  }
  ImFormatString(name,0x10,"##Combo_%02d",(ulong)(uint)(pIVar2->BeginPopupStack).Size);
  pIVar6 = FindWindowByName(name);
  if ((pIVar6 != (ImGuiWindow *)0x0) && (pIVar6->WasActive == true)) {
    size_expected = CalcWindowExpectedSize(pIVar6);
    if ((flags & 1U) != 0) {
      pIVar6->AutoPosLastDirection = 0;
    }
    r_outer = GetWindowAllowedExtentRect(pIVar6);
    local_60.y = frame_bb.Max.y;
    local_60.x = frame_bb.Min.x;
    pos = FindBestWindowPosForPopupEx
                    (&local_60,&size_expected,&pIVar6->AutoPosLastDirection,&r_outer,&frame_bb,
                     ImGuiPopupPositionPolicy_ComboBox);
    local_60.x = 0.0;
    local_60.y = 0.0;
    SetNextWindowPos(&pos,0,&local_60);
  }
  r_outer.Min.y = (pIVar2->Style).WindowPadding.y;
  r_outer.Min.x = (pIVar2->Style).FramePadding.x;
  PushStyleVar(1,&r_outer.Min);
  bVar3 = Begin(name,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar3) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui_widgets.cpp"
                  ,0x606,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}